

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O3

void __thiscall Database::Database(Database *this,string *dir,int id)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  pointer pcVar3;
  uint uVar4;
  undefined8 *puVar5;
  uint uVar6;
  ulong uVar7;
  uint __val;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  undefined8 *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  paVar1 = &(this->file_prefix).field_2;
  this->id = id;
  (this->file_prefix)._M_dataplus._M_p = (pointer)paVar1;
  (this->file_prefix)._M_string_length = 0;
  (this->file_prefix).field_2._M_local_buf[0] = '\0';
  pthread_rwlock_init((pthread_rwlock_t *)this,(pthread_rwlockattr_t *)0x0);
  pcVar3 = (dir->_M_dataplus)._M_p;
  local_98 = local_88;
  local_38 = paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar3,pcVar3 + dir->_M_string_length);
  std::__cxx11::string::append((char *)&local_98);
  __len = 1;
  __val = -id;
  if (0 < id) {
    __val = id;
  }
  if (9 < __val) {
    uVar7 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar6 = (uint)uVar7;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_001044cc;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_001044cc;
      }
      if (uVar6 < 10000) goto LAB_001044cc;
      uVar7 = uVar7 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_001044cc:
  local_58 = local_48;
  std::__cxx11::string::_M_construct((ulong)&local_58,(char)__len - (char)(id >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)id >> 0x1f) + (long)local_58),__len,__val);
  uVar7 = 0xf;
  if (local_98 != local_88) {
    uVar7 = local_88[0];
  }
  if (uVar7 < (ulong)(local_50 + local_90)) {
    uVar7 = 0xf;
    if (local_58 != local_48) {
      uVar7 = local_48[0];
    }
    if ((ulong)(local_50 + local_90) <= uVar7) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_98);
      goto LAB_00104558;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_58);
LAB_00104558:
  local_78 = &local_68;
  puVar2 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar2) {
    local_68 = *puVar2;
    uStack_60 = puVar5[3];
  }
  else {
    local_68 = *puVar2;
    local_78 = (undefined8 *)*puVar5;
  }
  local_70 = puVar5[1];
  *puVar5 = puVar2;
  puVar5[1] = 0;
  *(undefined1 *)puVar2 = 0;
  std::__cxx11::string::operator=((string *)&this->file_prefix,(string *)&local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  initIndex(this);
  initSlices(this);
  return;
}

Assistant:

Database::Database(const std::string &dir, int id): id(id) {
    pthread_rwlock_init(&rwlock, nullptr);
    file_prefix = dir + "." + std::to_string(id);
//    printf("Database shard %d initing...\n", id);
    initIndex();
    initSlices();
}